

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O1

void __thiscall cmCTestScriptHandler::Initialize(cmCTestScriptHandler *this)

{
  cmGlobalGenerator *pcVar1;
  
  cmCTestGenericHandler::Initialize(&this->super_cmCTestGenericHandler);
  this->Backup = false;
  this->EmptyBinDir = false;
  this->EmptyBinDirOnce = false;
  (this->SourceDir)._M_string_length = 0;
  *(this->SourceDir)._M_dataplus._M_p = '\0';
  (this->BinaryDir)._M_string_length = 0;
  *(this->BinaryDir)._M_dataplus._M_p = '\0';
  (this->BackupSourceDir)._M_string_length = 0;
  *(this->BackupSourceDir)._M_dataplus._M_p = '\0';
  (this->BackupBinaryDir)._M_string_length = 0;
  *(this->BackupBinaryDir)._M_dataplus._M_p = '\0';
  (this->CTestRoot)._M_string_length = 0;
  *(this->CTestRoot)._M_dataplus._M_p = '\0';
  (this->CVSCheckOut)._M_string_length = 0;
  *(this->CVSCheckOut)._M_dataplus._M_p = '\0';
  (this->CTestCmd)._M_string_length = 0;
  *(this->CTestCmd)._M_dataplus._M_p = '\0';
  (this->UpdateCmd)._M_string_length = 0;
  *(this->UpdateCmd)._M_dataplus._M_p = '\0';
  (this->CTestEnv)._M_string_length = 0;
  *(this->CTestEnv)._M_dataplus._M_p = '\0';
  (this->InitialCache)._M_string_length = 0;
  *(this->InitialCache)._M_dataplus._M_p = '\0';
  (this->CMakeCmd)._M_string_length = 0;
  *(this->CMakeCmd)._M_dataplus._M_p = '\0';
  (this->CMOutFile)._M_string_length = 0;
  *(this->CMOutFile)._M_dataplus._M_p = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->ExtraUpdates,
                    (this->ExtraUpdates).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  this->MinimumInterval = 1200.0;
  this->ContinuousDuration = -1.0;
  (this->ScriptStartTime).__d.__r = 0;
  std::__uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>::reset
            ((__uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_> *)&this->Makefile,
             (pointer)0x0);
  pcVar1 = (this->GlobalGenerator)._M_t.
           super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
           super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
           super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
  this->ParentMakefile = (cmMakefile *)0x0;
  (this->GlobalGenerator)._M_t.
  super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
  super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
  super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl = (cmGlobalGenerator *)0x0;
  if (pcVar1 != (cmGlobalGenerator *)0x0) {
    (*pcVar1->_vptr_cmGlobalGenerator[1])();
  }
  std::__uniq_ptr_impl<cmake,_std::default_delete<cmake>_>::reset
            ((__uniq_ptr_impl<cmake,_std::default_delete<cmake>_> *)&this->CMake,(pointer)0x0);
  return;
}

Assistant:

void cmCTestScriptHandler::Initialize()
{
  this->Superclass::Initialize();
  this->Backup = false;
  this->EmptyBinDir = false;
  this->EmptyBinDirOnce = false;

  this->SourceDir.clear();
  this->BinaryDir.clear();
  this->BackupSourceDir.clear();
  this->BackupBinaryDir.clear();
  this->CTestRoot.clear();
  this->CVSCheckOut.clear();
  this->CTestCmd.clear();
  this->UpdateCmd.clear();
  this->CTestEnv.clear();
  this->InitialCache.clear();
  this->CMakeCmd.clear();
  this->CMOutFile.clear();
  this->ExtraUpdates.clear();

  this->MinimumInterval = 20 * 60;
  this->ContinuousDuration = -1;

  // what time in seconds did this script start running
  this->ScriptStartTime = std::chrono::steady_clock::time_point();

  this->Makefile.reset();
  this->ParentMakefile = nullptr;

  this->GlobalGenerator.reset();

  this->CMake.reset();
}